

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

bool __thiscall QAbstractSocket::waitForConnected(QAbstractSocket *this,int msecs)

{
  bool bVar1;
  int iVar2;
  QAbstractSocketPrivate *this_00;
  QAbstractSocketEngine *pQVar3;
  bool bVar4;
  char cVar5;
  long lVar6;
  QArrayData *pQVar7;
  QArrayDataPointer<QHostAddress> *this_01;
  QHostAddress *pQVar8;
  long in_FS_OFFSET;
  bool timedOut;
  QHostAddress temp;
  undefined1 local_78 [24];
  QHostAddress *pQStack_60;
  QArrayDataPointer<QHostAddress> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&this->field_0x8;
  bVar4 = true;
  if (this_00->state != ConnectedState) {
    bVar1 = this_00->pendingClose;
    this_00->pendingClose = false;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QHostAddress *)&DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)(local_78 + 0x10),(long)msecs,CoarseTimer);
    if (this_00->state == HostLookupState) {
      QHostInfo::abortHostLookup(this_00->hostLookupId);
      this_00->hostLookupId = -1;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QHostAddress::QHostAddress((QHostAddress *)(local_78 + 8));
      bVar4 = QHostAddress::setAddress((QHostAddress *)(local_78 + 8),&this_00->hostName);
      if (bVar4) {
        this_01 = (QArrayDataPointer<QHostAddress> *)local_78;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QHostInfo::QHostInfo((QHostInfo *)this_01,-1);
        local_58.d = (Data *)0x0;
        local_58.ptr = (QHostAddress *)0x0;
        local_58.size = 0;
        QtPrivate::QMovableArrayOps<QHostAddress>::emplace<QHostAddress_const&>
                  ((QMovableArrayOps<QHostAddress> *)&local_58,0,(QHostAddress *)(local_78 + 8));
        QList<QHostAddress>::end((QList<QHostAddress> *)&local_58);
        QHostInfo::setAddresses((QHostInfo *)this_01,(QList<QHostAddress> *)&local_58);
        QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&local_58);
        QAbstractSocketPrivate::_q_startConnecting(this_00,(QHostInfo *)this_01);
      }
      else {
        this_01 = &local_58;
        QHostInfo::fromName((QHostInfo *)this_01,&this_00->hostName);
        QAbstractSocketPrivate::_q_startConnecting(this_00,(QHostInfo *)this_01);
      }
      QHostInfo::~QHostInfo((QHostInfo *)this_01);
      QHostAddress::~QHostAddress((QHostAddress *)(local_78 + 8));
    }
    if (*(int *)(*(long *)&this->field_0x8 + 0x260) == 0) {
      bVar4 = false;
    }
    else {
      local_78[0] = 1;
      iVar2 = *(int *)(*(long *)&this->field_0x8 + 0x260);
      while ((iVar2 == 2 &&
             (cVar5 = QDeadlineTimer::hasExpired(), pQVar8 = pQStack_60,
             pQVar7 = (QArrayData *)local_78._16_8_, cVar5 == '\0'))) {
        if (((QArrayData *)local_78._16_8_ != (QArrayData *)0x7fffffffffffffff) &&
           (lVar6 = QDeadlineTimer::rawRemainingTimeNSecs(), 30000000000 < lVar6)) {
          local_58.d = (Data *)0x0;
          local_58.ptr = (QHostAddress *)&DAT_100000000;
          QDeadlineTimer::setPreciseRemainingTime((longlong)&local_58,0,0xfc23ac00);
          pQVar7 = &(local_58.d)->super_QArrayData;
          pQVar8 = local_58.ptr;
        }
        local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
        pQVar3 = this_00->socketEngine;
        if (((pQVar3 == (QAbstractSocketEngine *)0x0) ||
            (cVar5 = (**(code **)(*(long *)pQVar3 + 0x128))(pQVar3,pQVar7,pQVar8,local_78),
            cVar5 == '\0')) || (local_78[0] != '\0')) {
          QAbstractSocketPrivate::_q_connectToNextAddress(this_00);
        }
        else {
          QAbstractSocketPrivate::_q_testConnection(this_00);
        }
        iVar2 = *(int *)(*(long *)&this->field_0x8 + 0x260);
      }
      if (((local_78[0] == '\x01') && (*(int *)(*(long *)&this->field_0x8 + 0x260) != 3)) ||
         (*(int *)(*(long *)&this->field_0x8 + 0x260) == 2)) {
        QMetaObject::tr((char *)&local_58,(char *)&staticMetaObject,0x2824e4);
        this_00->socketError = SocketTimeoutError;
        QString::operator=((QString *)&this_00->field_0x168,(QString *)&local_58);
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
          }
        }
        this_00->state = UnconnectedState;
        local_58.ptr = (QHostAddress *)(local_78 + 8);
        local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
        local_58.d = (Data *)0x0;
        QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_58.d);
        QAbstractSocketPrivate::resetSocketLayer(this_00);
      }
      bVar4 = *(int *)(*(long *)&this->field_0x8 + 0x260) == 3;
      if ((bVar4) && (bVar1 != false)) {
        (**(code **)(*(long *)this + 0x100))(this);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocket::waitForConnected(int msecs)
{
    Q_D(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i)", msecs);
#endif

    if (state() == ConnectedState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) already connected", msecs);
#endif
        return true;
    }

    bool wasPendingClose = d->pendingClose;
    d->pendingClose = false;
    QDeadlineTimer deadline{msecs};

    if (d->state == HostLookupState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) doing host name lookup", msecs);
#endif
        QHostInfo::abortHostLookup(d->hostLookupId);
        d->hostLookupId = -1;
        QHostAddress temp;
        if (temp.setAddress(d->hostName)) {
            QHostInfo info;
            info.setAddresses(QList<QHostAddress>() << temp);
            d->_q_startConnecting(info);
        } else {
            d->_q_startConnecting(QHostInfo::fromName(d->hostName));
        }
    }
    if (state() == UnconnectedState)
        return false; // connect not im progress anymore!

    bool timedOut = true;
#if defined (QABSTRACTSOCKET_DEBUG)
    int attempt = 1;
#endif
    while (state() == ConnectingState && !deadline.hasExpired()) {
        QDeadlineTimer timer = deadline;
        if (!deadline.isForever() && deadline.remainingTimeAsDuration() > DefaultConnectTimeout)
            timer = QDeadlineTimer(DefaultConnectTimeout);
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) waiting %.2f secs for connection attempt #%i",
               msecs, timer.remainingTime() / 1000.0, attempt++);
#endif
        timedOut = false;

        if (d->socketEngine && d->socketEngine->waitForWrite(timer, &timedOut) && !timedOut) {
            d->_q_testConnection();
        } else {
            d->_q_connectToNextAddress();
        }
    }

    if ((timedOut && state() != ConnectedState) || state() == ConnectingState) {
        d->setError(SocketTimeoutError, tr("Socket operation timed out"));
        d->state = UnconnectedState;
        emit stateChanged(d->state);
        d->resetSocketLayer();
    }

#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i) == %s", msecs,
           state() == ConnectedState ? "true" : "false");
#endif
    if (state() != ConnectedState)
        return false;
    if (wasPendingClose)
        disconnectFromHost();
    return true;
}